

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membank_factory.cpp
# Opt level: O0

MemBankList *
n_e_s::core::MemBankFactory::create_nes_mem_banks
          (MemBankList *__return_storage_ptr__,IPpu *ppu,IRom *rom,INesController *controller1,
          INesController *controller2)

{
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16408,_(unsigned_short)16415,_(unsigned_short)8>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16408,_(unsigned_short)16415,_(unsigned_short)8>_>_>
  local_b8;
  unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> local_b0;
  unique_ptr<n_e_s::core::MemBankControllerIO,_std::default_delete<n_e_s::core::MemBankControllerIO>_>
  local_a8;
  unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> local_a0;
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16384,_(unsigned_short)16405,_(unsigned_short)22>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16384,_(unsigned_short)16405,_(unsigned_short)22>_>_>
  local_98;
  unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> local_90;
  IPpu *local_88;
  anon_class_8_1_ba1d6dd5 local_80;
  unique_ptr<n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>,_std::default_delete<n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>_>_>
  local_78;
  unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> local_70;
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)0,_(unsigned_short)8191,_(unsigned_short)2048>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)0,_(unsigned_short)8191,_(unsigned_short)2048>_>_>
  local_68;
  unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> local_60 [3];
  unique_ptr<n_e_s::core::(anonymous_namespace)::CpuRomTranslator,_std::default_delete<n_e_s::core::(anonymous_namespace)::CpuRomTranslator>_>
  local_48;
  unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> local_40;
  undefined1 local_31;
  INesController *local_30;
  INesController *controller2_local;
  INesController *controller1_local;
  IRom *rom_local;
  IPpu *ppu_local;
  MemBankList *mem_banks;
  
  local_31 = 0;
  local_30 = controller2;
  controller2_local = controller1;
  controller1_local = (INesController *)rom;
  rom_local = (IRom *)ppu;
  ppu_local = (IPpu *)__return_storage_ptr__;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::vector(__return_storage_ptr__);
  std::make_unique<n_e_s::core::(anonymous_namespace)::CpuRomTranslator,n_e_s::core::IRom*&>
            ((IRom **)&local_48);
  std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>::
  unique_ptr<n_e_s::core::(anonymous_namespace)::CpuRomTranslator,std::default_delete<n_e_s::core::(anonymous_namespace)::CpuRomTranslator>,void>
            ((unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>> *)
             &local_40,&local_48);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)&local_40);
  std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>::~unique_ptr
            (&local_40);
  std::
  unique_ptr<n_e_s::core::(anonymous_namespace)::CpuRomTranslator,_std::default_delete<n_e_s::core::(anonymous_namespace)::CpuRomTranslator>_>
  ::~unique_ptr(&local_48);
  std::
  make_unique<n_e_s::core::MemBank<(unsigned_short)0,(unsigned_short)8191,(unsigned_short)2048>>();
  std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)0,(unsigned_short)8191,(unsigned_short)2048>,std::default_delete<n_e_s::core::MemBank<(unsigned_short)0,(unsigned_short)8191,(unsigned_short)2048>>,void>
            ((unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>> *)
             local_60,&local_68);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_60);
  std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>::~unique_ptr
            (local_60);
  std::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)0,_(unsigned_short)8191,_(unsigned_short)2048>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)0,_(unsigned_short)8191,_(unsigned_short)2048>_>_>
  ::~unique_ptr(&local_68);
  local_80 = anon_unknown_1::create_ppu_reader((IPpu *)rom_local);
  local_88 = (IPpu *)anon_unknown_1::create_ppu_writer((IPpu *)rom_local);
  std::
  make_unique<n_e_s::core::MappedMemBank<(unsigned_short)8192,(unsigned_short)16383,(unsigned_short)8>,n_e_s::core::(anonymous_namespace)::create_ppu_reader(n_e_s::core::IPpu*)::__0,n_e_s::core::(anonymous_namespace)::create_ppu_writer(n_e_s::core::IPpu*)::__0>
            ((anon_class_8_1_ba1d6dd5 *)&local_78,&local_80);
  std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>::
  unique_ptr<n_e_s::core::MappedMemBank<(unsigned_short)8192,(unsigned_short)16383,(unsigned_short)8>,std::default_delete<n_e_s::core::MappedMemBank<(unsigned_short)8192,(unsigned_short)16383,(unsigned_short)8>>,void>
            ((unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>> *)
             &local_70,&local_78);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)&local_70);
  std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>::~unique_ptr
            (&local_70);
  std::
  unique_ptr<n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>,_std::default_delete<n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>_>_>
  ::~unique_ptr(&local_78);
  std::
  make_unique<n_e_s::core::MemBank<(unsigned_short)16384,(unsigned_short)16405,(unsigned_short)22>>
            ();
  std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16384,(unsigned_short)16405,(unsigned_short)22>,std::default_delete<n_e_s::core::MemBank<(unsigned_short)16384,(unsigned_short)16405,(unsigned_short)22>>,void>
            ((unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>> *)
             &local_90,&local_98);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)&local_90);
  std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>::~unique_ptr
            (&local_90);
  std::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16384,_(unsigned_short)16405,_(unsigned_short)22>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16384,_(unsigned_short)16405,_(unsigned_short)22>_>_>
  ::~unique_ptr(&local_98);
  std::
  make_unique<n_e_s::core::MemBankControllerIO,n_e_s::core::INesController*&,n_e_s::core::INesController*&>
            ((INesController **)&local_a8,&controller2_local);
  std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>::
  unique_ptr<n_e_s::core::MemBankControllerIO,std::default_delete<n_e_s::core::MemBankControllerIO>,void>
            ((unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>> *)
             &local_a0,&local_a8);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)&local_a0);
  std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>::~unique_ptr
            (&local_a0);
  std::
  unique_ptr<n_e_s::core::MemBankControllerIO,_std::default_delete<n_e_s::core::MemBankControllerIO>_>
  ::~unique_ptr(&local_a8);
  std::
  make_unique<n_e_s::core::MemBank<(unsigned_short)16408,(unsigned_short)16415,(unsigned_short)8>>()
  ;
  std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16408,(unsigned_short)16415,(unsigned_short)8>,std::default_delete<n_e_s::core::MemBank<(unsigned_short)16408,(unsigned_short)16415,(unsigned_short)8>>,void>
            ((unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>> *)
             &local_b0,&local_b8);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)&local_b0);
  std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>::~unique_ptr
            (&local_b0);
  std::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16408,_(unsigned_short)16415,_(unsigned_short)8>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16408,_(unsigned_short)16415,_(unsigned_short)8>_>_>
  ::~unique_ptr(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

MemBankList MemBankFactory::create_nes_mem_banks(IPpu *ppu,
        IRom *rom,
        INesController *controller1,
        INesController *controller2) {
    MemBankList mem_banks;

    // Rom, make sure this is first so the mapper can decide if it wants to
    // handle the address or not.
    mem_banks.push_back(std::make_unique<CpuRomTranslator>(rom));

    // Ram, repeats every 0x800 byte
    mem_banks.push_back(std::make_unique<MemBank<0x0000, 0x1FFF, 0x800>>());

    // Ppu, repeats every 0x8 byte
    mem_banks.push_back(std::make_unique<MappedMemBank<0x2000, 0x3FFF, 0x8>>(
            create_ppu_reader(ppu), create_ppu_writer(ppu)));

    // Io
    mem_banks.push_back(std::make_unique<MemBank<0x4000, 0x4015, 0x16>>());
    mem_banks.push_back(
            std::make_unique<MemBankControllerIO>(controller1, controller2));

    // Io dev
    mem_banks.push_back(std::make_unique<MemBank<0x4018, 0x401F, 0x8>>());

    return mem_banks;
}